

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext.cpp
# Opt level: O0

bool __thiscall
QEGLPlatformContext::makeCurrent(QEGLPlatformContext *this,QPlatformSurface *surface)

{
  int iVar1;
  uint uVar2;
  undefined4 extraout_var;
  EGLContext pvVar4;
  EGLDisplay pvVar5;
  long lVar6;
  ulong uVar7;
  long *in_RSI;
  QEGLPlatformContext *in_RDI;
  long in_FS_OFFSET;
  int requestedSwapInterval;
  int swapInterval;
  bool ok;
  EGLSurface eglSurface;
  bool intervalOk;
  QByteArray swapIntervalString;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  bool local_51;
  char local_50 [32];
  QSurfaceFormat local_30;
  byte local_21;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  long lVar3;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  eglBindAPI(in_RDI->m_api);
  iVar1 = (*(in_RDI->super_QPlatformOpenGLContext)._vptr_QPlatformOpenGLContext[0x11])
                    (in_RDI,in_RSI);
  lVar3 = CONCAT44(extraout_var,iVar1);
  pvVar4 = (EGLContext)eglGetCurrentContext();
  if ((((pvVar4 == in_RDI->m_eglContext) &&
       (pvVar5 = (EGLDisplay)eglGetCurrentDisplay(), pvVar5 == in_RDI->m_eglDisplay)) &&
      (lVar6 = eglGetCurrentSurface(0x305a), lVar6 == lVar3)) &&
     (lVar6 = eglGetCurrentSurface(0x3059), lVar6 == lVar3)) {
    local_51 = true;
  }
  else {
    iVar1 = eglMakeCurrent(in_RDI->m_eglDisplay,lVar3,lVar3,in_RDI->m_eglContext);
    local_51 = iVar1 != 0;
    if (local_51) {
      if ((in_RDI->m_swapIntervalEnvChecked & 1U) == 0) {
        in_RDI->m_swapIntervalEnvChecked = true;
        uVar7 = qEnvironmentVariableIsSet("QT_QPA_EGLFS_SWAPINTERVAL");
        if ((uVar7 & 1) != 0) {
          local_20 = &DAT_aaaaaaaaaaaaaaaa;
          local_18 = &DAT_aaaaaaaaaaaaaaaa;
          local_10 = &DAT_aaaaaaaaaaaaaaaa;
          qgetenv((char *)&local_20);
          local_21 = 0xaa;
          iVar1 = QByteArray::toInt((bool *)&local_20,(int)&local_21);
          if ((local_21 & 1) != 0) {
            in_RDI->m_swapIntervalFromEnv = iVar1;
          }
          QByteArray::~QByteArray((QByteArray *)0xa91c3e);
        }
      }
      uVar2 = 0;
      if (in_RDI->m_swapIntervalFromEnv < 0) {
        (**(code **)(*in_RSI + 0x10))(&local_30);
        uVar2 = 0x1000000;
        iVar1 = QSurfaceFormat::swapInterval(&local_30);
      }
      else {
        iVar1 = in_RDI->m_swapIntervalFromEnv;
      }
      if ((uVar2 & 0x1000000) != 0) {
        QSurfaceFormat::~QSurfaceFormat((QSurfaceFormat *)CONCAT44(iVar1,iVar1));
      }
      if (((-1 < iVar1) && (in_RDI->m_swapInterval != iVar1)) &&
         (in_RDI->m_swapInterval = iVar1, lVar3 != 0)) {
        pvVar5 = eglDisplay(in_RDI);
        eglSwapInterval(pvVar5,in_RDI->m_swapInterval);
      }
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (char *)in_RDI,in_stack_ffffffffffffff74,
                 (char *)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
      uVar2 = eglGetError();
      QMessageLogger::warning
                (local_50,"QEGLPlatformContext: eglMakeCurrent failed: %x",(ulong)uVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_51;
}

Assistant:

bool QEGLPlatformContext::makeCurrent(QPlatformSurface *surface)
{
    Q_ASSERT(surface->surface()->supportsOpenGL());

    eglBindAPI(m_api);

    EGLSurface eglSurface = eglSurfaceForPlatformSurface(surface);

    // shortcut: on some GPUs, eglMakeCurrent is not a cheap operation
    if (eglGetCurrentContext() == m_eglContext &&
        eglGetCurrentDisplay() == m_eglDisplay &&
        eglGetCurrentSurface(EGL_READ) == eglSurface &&
        eglGetCurrentSurface(EGL_DRAW) == eglSurface) {
        return true;
    }

    const bool ok = eglMakeCurrent(m_eglDisplay, eglSurface, eglSurface, m_eglContext);
    if (ok) {
        if (!m_swapIntervalEnvChecked) {
            m_swapIntervalEnvChecked = true;
            if (qEnvironmentVariableIsSet("QT_QPA_EGLFS_SWAPINTERVAL")) {
                QByteArray swapIntervalString = qgetenv("QT_QPA_EGLFS_SWAPINTERVAL");
                bool intervalOk;
                const int swapInterval = swapIntervalString.toInt(&intervalOk);
                if (intervalOk)
                    m_swapIntervalFromEnv = swapInterval;
            }
        }
        const int requestedSwapInterval = m_swapIntervalFromEnv >= 0
            ? m_swapIntervalFromEnv
            : surface->format().swapInterval();
        if (requestedSwapInterval >= 0 && m_swapInterval != requestedSwapInterval) {
            m_swapInterval = requestedSwapInterval;
            if (eglSurface != EGL_NO_SURFACE) // skip if using surfaceless context
                eglSwapInterval(eglDisplay(), m_swapInterval);
        }
#if defined(Q_OS_VXWORKS) && defined(Q_PROCESSOR_X86_64)
        // Clear set of framebuffers as workaround for display artifacts found
        // in Wind River's Mesa OpenGL implementation
        static bool firstWindow = true;
        if (firstWindow && (QSurface::Window == surface->surface()->surfaceClass())) {
            glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
            swapBuffers(surface);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
            swapBuffers(surface);
            glClear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
            swapBuffers(surface);
            firstWindow = false;
        }
#endif
    } else {
        qWarning("QEGLPlatformContext: eglMakeCurrent failed: %x", eglGetError());
    }

    return ok;
}